

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  undefined8 *puVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  undefined8 *puVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  int iVar32;
  undefined4 uVar33;
  Geometry *pGVar34;
  long lVar35;
  long lVar36;
  RTCFilterFunctionN p_Var37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  bool bVar41;
  undefined8 uVar42;
  int iVar43;
  AABBNodeMB4D *node1;
  ulong uVar44;
  long lVar45;
  RTCRayN *pRVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  NodeRef *pNVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  float *vertices;
  ulong uVar61;
  undefined4 uVar62;
  ulong unaff_R14;
  size_t mask;
  ulong uVar63;
  size_t sVar64;
  bool bVar65;
  bool bVar66;
  float fVar67;
  float fVar68;
  float fVar71;
  float fVar72;
  undefined1 auVar69 [16];
  float fVar73;
  undefined1 auVar70 [16];
  float fVar79;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar85;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar94;
  float fVar95;
  uint uVar96;
  float fVar97;
  uint uVar98;
  float fVar99;
  uint uVar100;
  float fVar101;
  uint uVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float local_ae8;
  float fStack_ae4;
  undefined8 uStack_a10;
  undefined1 local_9e8 [16];
  undefined1 (*local_9d0) [16];
  NodeRef *local_9c8;
  Scene *scene;
  ulong local_9b8;
  ulong local_9b0;
  ulong local_9a8;
  ulong local_9a0;
  RTCFilterFunctionNArguments args;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined1 local_8f8 [16];
  int local_8d8;
  int iStack_8d4;
  int iStack_8d0;
  int iStack_8cc;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  float local_878 [4];
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  undefined1 auVar90 [16];
  
  stack[0] = root;
  fVar26 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar27 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar28 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar29 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar30 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar31 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar54 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_9a8 = uVar57 ^ 0x10;
  local_9b0 = uVar59 ^ 0x10;
  iVar32 = (tray->tnear).field_0.i[k];
  iVar43 = (tray->tfar).field_0.i[k];
  auVar69._4_4_ = iVar43;
  auVar69._0_4_ = iVar43;
  auVar69._8_4_ = iVar43;
  auVar69._12_4_ = iVar43;
  local_9d0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar52 = stack + 1;
  do {
    local_9c8 = pNVar52;
    if (local_9c8 == stack) break;
    pNVar52 = local_9c8 + -1;
    sVar64 = local_9c8[-1].ptr;
    do {
      if ((sVar64 & 8) == 0) {
        uVar44 = sVar64 & 0xfffffffffffffff0;
        fVar67 = *(float *)(ray + k * 4 + 0x70);
        pfVar23 = (float *)(uVar44 + 0x80 + uVar54);
        pfVar21 = (float *)(uVar44 + 0x20 + uVar54);
        auVar82._0_4_ = ((*pfVar23 * fVar67 + *pfVar21) - fVar26) * fVar29;
        auVar82._4_4_ = ((pfVar23[1] * fVar67 + pfVar21[1]) - fVar26) * fVar29;
        auVar82._8_4_ = ((pfVar23[2] * fVar67 + pfVar21[2]) - fVar26) * fVar29;
        auVar82._12_4_ = ((pfVar23[3] * fVar67 + pfVar21[3]) - fVar26) * fVar29;
        auVar87._4_4_ = iVar32;
        auVar87._0_4_ = iVar32;
        auVar87._8_4_ = iVar32;
        auVar87._12_4_ = iVar32;
        pfVar23 = (float *)(uVar44 + 0x80 + uVar57);
        pfVar21 = (float *)(uVar44 + 0x20 + uVar57);
        auVar74 = maxps(auVar87,auVar82);
        auVar86._0_4_ = ((*pfVar23 * fVar67 + *pfVar21) - fVar27) * fVar30;
        auVar86._4_4_ = ((pfVar23[1] * fVar67 + pfVar21[1]) - fVar27) * fVar30;
        auVar86._8_4_ = ((pfVar23[2] * fVar67 + pfVar21[2]) - fVar27) * fVar30;
        auVar86._12_4_ = ((pfVar23[3] * fVar67 + pfVar21[3]) - fVar27) * fVar30;
        pfVar23 = (float *)(uVar44 + 0x80 + uVar59);
        pfVar21 = (float *)(uVar44 + 0x20 + uVar59);
        auVar81._0_4_ = ((*pfVar23 * fVar67 + *pfVar21) - fVar28) * fVar31;
        auVar81._4_4_ = ((pfVar23[1] * fVar67 + pfVar21[1]) - fVar28) * fVar31;
        auVar81._8_4_ = ((pfVar23[2] * fVar67 + pfVar21[2]) - fVar28) * fVar31;
        auVar81._12_4_ = ((pfVar23[3] * fVar67 + pfVar21[3]) - fVar28) * fVar31;
        auVar87 = maxps(auVar86,auVar81);
        auVar87 = maxps(auVar74,auVar87);
        pfVar23 = (float *)(uVar44 + 0x80 + (uVar54 ^ 0x10));
        pfVar21 = (float *)(uVar44 + 0x20 + (uVar54 ^ 0x10));
        auVar88._0_4_ = ((*pfVar23 * fVar67 + *pfVar21) - fVar26) * fVar29;
        auVar88._4_4_ = ((pfVar23[1] * fVar67 + pfVar21[1]) - fVar26) * fVar29;
        auVar88._8_4_ = ((pfVar23[2] * fVar67 + pfVar21[2]) - fVar26) * fVar29;
        auVar88._12_4_ = ((pfVar23[3] * fVar67 + pfVar21[3]) - fVar26) * fVar29;
        auVar82 = minps(auVar69,auVar88);
        pfVar24 = (float *)(uVar44 + 0x80 + local_9a8);
        pfVar21 = (float *)(uVar44 + 0x20 + local_9a8);
        pfVar25 = (float *)(uVar44 + 0x80 + local_9b0);
        pfVar23 = (float *)(uVar44 + 0x20 + local_9b0);
        auVar89._0_4_ = ((*pfVar24 * fVar67 + *pfVar21) - fVar27) * fVar30;
        auVar89._4_4_ = ((pfVar24[1] * fVar67 + pfVar21[1]) - fVar27) * fVar30;
        auVar89._8_4_ = ((pfVar24[2] * fVar67 + pfVar21[2]) - fVar27) * fVar30;
        auVar89._12_4_ = ((pfVar24[3] * fVar67 + pfVar21[3]) - fVar27) * fVar30;
        auVar74._4_4_ = ((pfVar25[1] * fVar67 + pfVar23[1]) - fVar28) * fVar31;
        auVar74._0_4_ = ((*pfVar25 * fVar67 + *pfVar23) - fVar28) * fVar31;
        auVar74._8_4_ = ((pfVar25[2] * fVar67 + pfVar23[2]) - fVar28) * fVar31;
        auVar74._12_4_ = ((pfVar25[3] * fVar67 + pfVar23[3]) - fVar28) * fVar31;
        auVar74 = minps(auVar89,auVar74);
        auVar74 = minps(auVar82,auVar74);
        bVar65 = auVar87._0_4_ <= auVar74._0_4_;
        bVar66 = auVar87._4_4_ <= auVar74._4_4_;
        bVar38 = auVar87._8_4_ <= auVar74._8_4_;
        bVar39 = auVar87._12_4_ <= auVar74._12_4_;
        if (((uint)sVar64 & 7) == 6) {
          bVar65 = (fVar67 < *(float *)(uVar44 + 0xf0) && *(float *)(uVar44 + 0xe0) <= fVar67) &&
                   bVar65;
          bVar66 = (fVar67 < *(float *)(uVar44 + 0xf4) && *(float *)(uVar44 + 0xe4) <= fVar67) &&
                   bVar66;
          bVar38 = (fVar67 < *(float *)(uVar44 + 0xf8) && *(float *)(uVar44 + 0xe8) <= fVar67) &&
                   bVar38;
          bVar39 = (fVar67 < *(float *)(uVar44 + 0xfc) && *(float *)(uVar44 + 0xec) <= fVar67) &&
                   bVar39;
        }
        auVar75._0_4_ = (uint)bVar65 * -0x80000000;
        auVar75._4_4_ = (uint)bVar66 * -0x80000000;
        auVar75._8_4_ = (uint)bVar38 * -0x80000000;
        auVar75._12_4_ = (uint)bVar39 * -0x80000000;
        uVar62 = movmskps((int)unaff_R14,auVar75);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar62);
      }
      if ((sVar64 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar96 = 4;
        }
        else {
          uVar44 = sVar64 & 0xfffffffffffffff0;
          lVar45 = 0;
          if (unaff_R14 != 0) {
            for (; (unaff_R14 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
            }
          }
          uVar96 = 0;
          sVar64 = *(size_t *)(uVar44 + lVar45 * 8);
          uVar49 = unaff_R14 - 1 & unaff_R14;
          if (uVar49 != 0) {
            pNVar52->ptr = sVar64;
            lVar45 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
              }
            }
            uVar48 = uVar49 - 1;
            while( true ) {
              pNVar52 = pNVar52 + 1;
              sVar64 = *(size_t *)(uVar44 + lVar45 * 8);
              uVar48 = uVar48 & uVar49;
              if (uVar48 == 0) break;
              pNVar52->ptr = sVar64;
              lVar45 = 0;
              if (uVar48 != 0) {
                for (; (uVar48 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                }
              }
              uVar49 = uVar48 - 1;
            }
          }
        }
      }
      else {
        uVar96 = 6;
      }
    } while (uVar96 == 0);
    if (uVar96 == 6) {
      uVar96 = 0;
      local_9b8 = (ulong)((uint)sVar64 & 0xf) - 8;
      bVar65 = local_9b8 != 0;
      if (bVar65) {
        uVar49 = sVar64 & 0xfffffffffffffff0;
        uVar44 = 0;
        do {
          lVar45 = uVar44 * 0x50;
          scene = context->scene;
          pGVar34 = (scene->geometries).items[*(uint *)(uVar49 + 0x30 + lVar45)].ptr;
          fVar67 = (pGVar34->time_range).lower;
          fVar80 = (pGVar34->time_range).upper - fVar67;
          fVar103 = ((*(float *)(ray + k * 4 + 0x70) - fVar67) / fVar80) * pGVar34->fnumTimeSegments
          ;
          auVar83 = roundss(ZEXT416((uint)fVar80),ZEXT416((uint)fVar103),9);
          fVar67 = pGVar34->fnumTimeSegments + -1.0;
          if (fVar67 <= auVar83._0_4_) {
            auVar83._0_4_ = fVar67;
          }
          fVar67 = 0.0;
          if (0.0 <= auVar83._0_4_) {
            fVar67 = auVar83._0_4_;
          }
          uVar50 = (ulong)*(uint *)(uVar49 + 4 + lVar45);
          lVar35 = *(long *)(*(long *)&pGVar34[2].numPrimitives + (long)(int)fVar67 * 0x38);
          lVar36 = *(long *)(*(long *)&pGVar34[2].numPrimitives + 0x38 + (long)(int)fVar67 * 0x38);
          pfVar21 = (float *)(lVar35 + (ulong)*(uint *)(uVar49 + lVar45) * 4);
          uVar61 = (ulong)*(uint *)(uVar49 + 0x10 + lVar45);
          pfVar23 = (float *)(lVar35 + uVar61 * 4);
          uVar48 = (ulong)*(uint *)(uVar49 + 0x20 + lVar45);
          pfVar24 = (float *)(lVar35 + uVar48 * 4);
          pfVar25 = (float *)(lVar35 + uVar50 * 4);
          uVar55 = (ulong)*(uint *)(uVar49 + 0x14 + lVar45);
          pfVar1 = (float *)(lVar35 + uVar55 * 4);
          uVar47 = (ulong)*(uint *)(uVar49 + 0x24 + lVar45);
          pfVar2 = (float *)(lVar35 + uVar47 * 4);
          uVar63 = (ulong)*(uint *)(uVar49 + 8 + lVar45);
          pfVar3 = (float *)(lVar35 + uVar63 * 4);
          uVar60 = (ulong)*(uint *)(uVar49 + 0x18 + lVar45);
          pfVar4 = (float *)(lVar35 + uVar60 * 4);
          uVar53 = (ulong)*(uint *)(uVar49 + 0x28 + lVar45);
          pfVar5 = (float *)(lVar35 + uVar53 * 4);
          uVar51 = (ulong)*(uint *)(uVar49 + 0xc + lVar45);
          pfVar6 = (float *)(lVar35 + uVar51 * 4);
          uVar58 = (ulong)*(uint *)(uVar49 + 0x1c + lVar45);
          pfVar7 = (float *)(lVar35 + uVar58 * 4);
          uVar56 = (ulong)*(uint *)(uVar49 + 0x2c + lVar45);
          pfVar8 = (float *)(lVar35 + uVar56 * 4);
          pfVar9 = (float *)(lVar36 + (ulong)*(uint *)(uVar49 + lVar45) * 4);
          puVar10 = (undefined8 *)(lVar36 + uVar61 * 4);
          uVar42 = *puVar10;
          fVar103 = fVar103 - fVar67;
          pfVar11 = (float *)(lVar36 + uVar50 * 4);
          pfVar12 = (float *)(lVar36 + uVar63 * 4);
          pfVar13 = (float *)(lVar36 + uVar51 * 4);
          pfVar14 = (float *)(lVar36 + uVar60 * 4);
          local_ae8 = (float)uVar42;
          fStack_ae4 = (float)((ulong)uVar42 >> 0x20);
          pfVar15 = (float *)(lVar36 + uVar55 * 4);
          pfVar16 = (float *)(lVar36 + uVar58 * 4);
          pfVar17 = (float *)(lVar36 + uVar48 * 4);
          pfVar18 = (float *)(lVar36 + uVar53 * 4);
          pfVar19 = (float *)(lVar36 + uVar47 * 4);
          pfVar20 = (float *)(lVar36 + uVar56 * 4);
          fVar67 = 1.0 - fVar103;
          fVar119 = *pfVar21 * fVar67 + *pfVar9 * fVar103;
          fVar121 = *pfVar25 * fVar67 + *pfVar11 * fVar103;
          fVar123 = *pfVar3 * fVar67 + *pfVar12 * fVar103;
          fVar125 = *pfVar6 * fVar67 + *pfVar13 * fVar103;
          fVar84 = pfVar21[1] * fVar67 + pfVar9[1] * fVar103;
          fVar91 = pfVar25[1] * fVar67 + pfVar11[1] * fVar103;
          fVar93 = pfVar3[1] * fVar67 + pfVar12[1] * fVar103;
          fVar94 = pfVar6[1] * fVar67 + pfVar13[1] * fVar103;
          fVar108 = pfVar21[2] * fVar67 + pfVar9[2] * fVar103;
          fVar109 = pfVar25[2] * fVar67 + pfVar11[2] * fVar103;
          fVar110 = pfVar3[2] * fVar67 + pfVar12[2] * fVar103;
          fVar111 = pfVar6[2] * fVar67 + pfVar13[2] * fVar103;
          puVar22 = (undefined8 *)(uVar49 + 0x30 + lVar45);
          local_938 = *puVar22;
          uStack_930 = puVar22[1];
          puVar22 = (undefined8 *)(uVar49 + 0x40 + lVar45);
          local_948 = *puVar22;
          uStack_940 = puVar22[1];
          fVar68 = fVar119 - (*pfVar23 * fVar67 + local_ae8 * fVar103);
          fVar71 = fVar121 - (*pfVar1 * fVar67 + *pfVar15 * fVar103);
          fVar72 = fVar123 - (*pfVar4 * fVar67 + *pfVar14 * fVar103);
          fVar73 = fVar125 - (*pfVar7 * fVar67 + *pfVar16 * fVar103);
          fVar104 = fVar84 - (pfVar23[1] * fVar67 + fStack_ae4 * fVar103);
          fVar105 = fVar91 - (pfVar1[1] * fVar67 + pfVar15[1] * fVar103);
          fVar106 = fVar93 - (pfVar4[1] * fVar67 + pfVar14[1] * fVar103);
          fVar107 = fVar94 - (pfVar7[1] * fVar67 + pfVar16[1] * fVar103);
          fVar130 = fVar108 - (pfVar23[2] * fVar67 + (float)puVar10[1] * fVar103);
          fVar131 = fVar109 - (pfVar1[2] * fVar67 + pfVar15[2] * fVar103);
          fVar132 = fVar110 - (pfVar4[2] * fVar67 + pfVar14[2] * fVar103);
          fVar133 = fVar111 - (pfVar7[2] * fVar67 + pfVar16[2] * fVar103);
          fVar126 = (*pfVar24 * fVar67 + *pfVar17 * fVar103) - fVar119;
          fVar127 = (*pfVar2 * fVar67 + *pfVar19 * fVar103) - fVar121;
          fVar128 = (*pfVar5 * fVar67 + *pfVar18 * fVar103) - fVar123;
          fVar129 = (*pfVar8 * fVar67 + *pfVar20 * fVar103) - fVar125;
          fVar95 = (pfVar24[1] * fVar67 + pfVar17[1] * fVar103) - fVar84;
          fVar97 = (pfVar2[1] * fVar67 + pfVar19[1] * fVar103) - fVar91;
          fVar99 = (pfVar5[1] * fVar67 + pfVar18[1] * fVar103) - fVar93;
          fVar101 = (pfVar8[1] * fVar67 + pfVar20[1] * fVar103) - fVar94;
          fVar115 = (fVar67 * pfVar24[2] + fVar103 * pfVar17[2]) - fVar108;
          fVar116 = (fVar67 * pfVar2[2] + fVar103 * pfVar19[2]) - fVar109;
          fVar117 = (fVar67 * pfVar5[2] + fVar103 * pfVar18[2]) - fVar110;
          fVar118 = (fVar67 * pfVar8[2] + fVar103 * pfVar20[2]) - fVar111;
          fVar85 = fVar130 * fVar95 - fVar104 * fVar115;
          fVar92 = fVar131 * fVar97 - fVar105 * fVar116;
          auVar90._0_8_ = CONCAT44(fVar92,fVar85);
          auVar90._8_4_ = fVar132 * fVar99 - fVar106 * fVar117;
          auVar90._12_4_ = fVar133 * fVar101 - fVar107 * fVar118;
          fVar67 = *(float *)(ray + k * 4);
          fVar80 = *(float *)(ray + k * 4 + 0x10);
          fVar103 = *(float *)(ray + k * 4 + 0x40);
          fVar79 = *(float *)(ray + k * 4 + 0x50);
          fVar119 = fVar119 - fVar67;
          fVar121 = fVar121 - fVar67;
          fVar123 = fVar123 - fVar67;
          fVar125 = fVar125 - fVar67;
          fVar84 = fVar84 - fVar80;
          fVar91 = fVar91 - fVar80;
          fVar93 = fVar93 - fVar80;
          fVar94 = fVar94 - fVar80;
          fVar134 = fVar119 * fVar79 - fVar84 * fVar103;
          fVar135 = fVar121 * fVar79 - fVar91 * fVar103;
          fVar136 = fVar123 * fVar79 - fVar93 * fVar103;
          fVar137 = fVar125 * fVar79 - fVar94 * fVar103;
          local_888._0_4_ = fVar68 * fVar115 - fVar130 * fVar126;
          local_888._4_4_ = fVar71 * fVar116 - fVar131 * fVar127;
          local_888._8_4_ = fVar72 * fVar117 - fVar132 * fVar128;
          local_888._12_4_ = fVar73 * fVar118 - fVar133 * fVar129;
          fVar67 = *(float *)(ray + k * 4 + 0x20);
          fVar80 = *(float *)(ray + k * 4 + 0x60);
          fVar108 = fVar108 - fVar67;
          fVar109 = fVar109 - fVar67;
          fVar110 = fVar110 - fVar67;
          fVar111 = fVar111 - fVar67;
          fVar67 = fVar108 * fVar103 - fVar119 * fVar80;
          fVar112 = fVar109 * fVar103 - fVar121 * fVar80;
          fVar113 = fVar110 * fVar103 - fVar123 * fVar80;
          fVar114 = fVar111 * fVar103 - fVar125 * fVar80;
          local_878[0] = fVar104 * fVar126 - fVar68 * fVar95;
          local_878[1] = fVar105 * fVar127 - fVar71 * fVar97;
          local_878[2] = fVar106 * fVar128 - fVar72 * fVar99;
          local_878[3] = fVar107 * fVar129 - fVar73 * fVar101;
          fVar138 = fVar84 * fVar80 - fVar108 * fVar79;
          fVar139 = fVar91 * fVar80 - fVar109 * fVar79;
          fVar140 = fVar93 * fVar80 - fVar110 * fVar79;
          fVar141 = fVar94 * fVar80 - fVar111 * fVar79;
          fVar120 = fVar103 * fVar85 + fVar79 * local_888._0_4_ + fVar80 * local_878[0];
          fVar122 = fVar103 * fVar92 + fVar79 * local_888._4_4_ + fVar80 * local_878[1];
          fVar124 = fVar103 * auVar90._8_4_ + fVar79 * local_888._8_4_ + fVar80 * local_878[2];
          fVar103 = fVar103 * auVar90._12_4_ + fVar79 * local_888._12_4_ + fVar80 * local_878[3];
          uVar96 = (uint)fVar120 & 0x80000000;
          uVar98 = (uint)fVar122 & 0x80000000;
          uVar100 = (uint)fVar124 & 0x80000000;
          uVar102 = (uint)fVar103 & 0x80000000;
          local_928 = (float)((uint)(fVar126 * fVar138 + fVar95 * fVar67 + fVar115 * fVar134) ^
                             uVar96);
          fStack_924 = (float)((uint)(fVar127 * fVar139 + fVar97 * fVar112 + fVar116 * fVar135) ^
                              uVar98);
          fStack_920 = (float)((uint)(fVar128 * fVar140 + fVar99 * fVar113 + fVar117 * fVar136) ^
                              uVar100);
          fStack_91c = (float)((uint)(fVar129 * fVar141 + fVar101 * fVar114 + fVar118 * fVar137) ^
                              uVar102);
          local_918 = (float)((uint)(fVar138 * fVar68 + fVar67 * fVar104 + fVar134 * fVar130) ^
                             uVar96);
          fStack_914 = (float)((uint)(fVar139 * fVar71 + fVar112 * fVar105 + fVar135 * fVar131) ^
                              uVar98);
          fStack_910 = (float)((uint)(fVar140 * fVar72 + fVar113 * fVar106 + fVar136 * fVar132) ^
                              uVar100);
          fStack_90c = (float)((uint)(fVar141 * fVar73 + fVar114 * fVar107 + fVar137 * fVar133) ^
                              uVar102);
          fVar67 = ABS(fVar120);
          fVar80 = ABS(fVar122);
          local_8f8._0_8_ = CONCAT44(fVar122,fVar120) & 0x7fffffff7fffffff;
          local_8f8._8_4_ = ABS(fVar124);
          local_8f8._12_4_ = ABS(fVar103);
          bVar38 = ((0.0 <= local_918 && 0.0 <= local_928) && fVar120 != 0.0) &&
                   local_928 + local_918 <= fVar67;
          auVar76._0_4_ = -(uint)bVar38;
          bVar41 = ((0.0 <= fStack_914 && 0.0 <= fStack_924) && fVar122 != 0.0) &&
                   fStack_924 + fStack_914 <= fVar80;
          auVar76._4_4_ = -(uint)bVar41;
          bVar39 = ((0.0 <= fStack_910 && 0.0 <= fStack_920) && fVar124 != 0.0) &&
                   fStack_920 + fStack_910 <= local_8f8._8_4_;
          auVar76._8_4_ = -(uint)bVar39;
          bVar66 = ((0.0 <= fStack_90c && 0.0 <= fStack_91c) && fVar103 != 0.0) &&
                   fStack_91c + fStack_90c <= local_8f8._12_4_;
          auVar76._12_4_ = -(uint)bVar66;
          iVar43 = movmskps((int)lVar45,auVar76);
          if (iVar43 != 0) {
            local_908 = (float)(uVar96 ^ (uint)(fVar119 * fVar85 +
                                               fVar84 * local_888._0_4_ + fVar108 * local_878[0]));
            fStack_904 = (float)(uVar98 ^ (uint)(fVar121 * fVar92 +
                                                fVar91 * local_888._4_4_ + fVar109 * local_878[1]));
            fStack_900 = (float)(uVar100 ^
                                (uint)(fVar123 * auVar90._8_4_ +
                                      fVar93 * local_888._8_4_ + fVar110 * local_878[2]));
            fStack_8fc = (float)(uVar102 ^
                                (uint)(fVar125 * auVar90._12_4_ +
                                      fVar94 * local_888._12_4_ + fVar111 * local_878[3]));
            fVar103 = *(float *)(ray + k * 4 + 0x30);
            fVar79 = *(float *)(ray + k * 4 + 0x80);
            local_8d8 = -(uint)((local_908 <= fVar79 * fVar67 && fVar103 * fVar67 < local_908) &&
                               bVar38);
            iStack_8d4 = -(uint)((fStack_904 <= fVar79 * fVar80 && fVar103 * fVar80 < fStack_904) &&
                                bVar41);
            iStack_8d0 = -(uint)((fStack_900 <= fVar79 * local_8f8._8_4_ &&
                                 fVar103 * local_8f8._8_4_ < fStack_900) && bVar39);
            iStack_8cc = -(uint)((fStack_8fc <= fVar79 * local_8f8._12_4_ &&
                                 fVar103 * local_8f8._12_4_ < fStack_8fc) && bVar66);
            auVar40._4_4_ = iStack_8d4;
            auVar40._0_4_ = local_8d8;
            auVar40._8_4_ = iStack_8d0;
            auVar40._12_4_ = iStack_8cc;
            iVar43 = movmskps((int)lVar36,auVar40);
            uVar48 = CONCAT44((int)((ulong)lVar36 >> 0x20),iVar43);
            if (iVar43 != 0) {
              uStack_a10 = auVar90._8_8_;
              local_898 = auVar90._0_8_;
              uStack_890 = uStack_a10;
              auVar74 = rcpps(local_888,local_8f8);
              fVar103 = auVar74._0_4_;
              fVar79 = auVar74._4_4_;
              fVar68 = auVar74._8_4_;
              fVar71 = auVar74._12_4_;
              fVar103 = (1.0 - fVar67 * fVar103) * fVar103 + fVar103;
              fVar79 = (1.0 - fVar80 * fVar79) * fVar79 + fVar79;
              fVar68 = (1.0 - local_8f8._8_4_ * fVar68) * fVar68 + fVar68;
              fVar71 = (1.0 - local_8f8._12_4_ * fVar71) * fVar71 + fVar71;
              local_8a8[0] = local_908 * fVar103;
              local_8a8[1] = fStack_904 * fVar79;
              local_8a8[2] = fStack_900 * fVar68;
              local_8a8[3] = fStack_8fc * fVar71;
              local_8c8._0_4_ = local_928 * fVar103;
              local_8c8._4_4_ = fStack_924 * fVar79;
              local_8c8._8_4_ = fStack_920 * fVar68;
              local_8c8._12_4_ = fStack_91c * fVar71;
              local_8b8._0_4_ = fVar103 * local_918;
              local_8b8._4_4_ = fVar79 * fStack_914;
              local_8b8._8_4_ = fVar68 * fStack_910;
              local_8b8._12_4_ = fVar71 * fStack_90c;
              local_9a0 = uVar44;
              do {
                uVar47 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                  }
                }
                local_808 = *(uint *)((long)&local_938 + uVar47 * 4);
                pGVar34 = (scene->geometries).items[local_808].ptr;
                if ((pGVar34->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar48 = uVar48 ^ 1L << (uVar47 & 0x3f);
                  bVar66 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar34->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar66 = false;
                }
                else {
                  uVar62 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_838 = *(undefined4 *)(local_8c8 + uVar47 * 4);
                  fVar67 = local_8a8[uVar47 - 4];
                  *(float *)(ray + k * 4 + 0x80) = local_8a8[uVar47];
                  args.context = context->user;
                  uVar33 = *(undefined4 *)((long)&local_948 + uVar47 * 4);
                  local_818._4_4_ = uVar33;
                  local_818._0_4_ = uVar33;
                  local_818._8_4_ = uVar33;
                  local_818._12_4_ = uVar33;
                  local_828._4_4_ = fVar67;
                  local_828._0_4_ = fVar67;
                  local_828._8_4_ = fVar67;
                  local_828._12_4_ = fVar67;
                  local_868 = *(undefined4 *)((long)&local_898 + uVar47 * 4);
                  local_858 = local_878[uVar47 - 4];
                  local_848 = local_878[uVar47];
                  uStack_864 = local_868;
                  uStack_860 = local_868;
                  uStack_85c = local_868;
                  fStack_854 = local_858;
                  fStack_850 = local_858;
                  fStack_84c = local_858;
                  fStack_844 = local_848;
                  fStack_840 = local_848;
                  fStack_83c = local_848;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  local_7f8 = (args.context)->instID[0];
                  uStack_7f4 = local_7f8;
                  uStack_7f0 = local_7f8;
                  uStack_7ec = local_7f8;
                  local_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = local_7e8;
                  uStack_7e0 = local_7e8;
                  uStack_7dc = local_7e8;
                  local_9e8 = *local_9d0;
                  args.valid = (int *)local_9e8;
                  args.geometryUserPtr = pGVar34->userPtr;
                  args.hit = (RTCHitN *)&local_868;
                  args.N = 4;
                  pRVar46 = (RTCRayN *)pGVar34->occlusionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar46 != (RTCRayN *)0x0) {
                    pRVar46 = (RTCRayN *)(*(code *)pRVar46)(&args);
                  }
                  if (local_9e8 == (undefined1  [16])0x0) {
                    auVar77._8_4_ = 0xffffffff;
                    auVar77._0_8_ = 0xffffffffffffffff;
                    auVar77._12_4_ = 0xffffffff;
                    auVar77 = auVar77 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var37 = context->args->filter;
                    if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar34->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var37)(&args);
                    }
                    auVar70._0_4_ = -(uint)(local_9e8._0_4_ == 0);
                    auVar70._4_4_ = -(uint)(local_9e8._4_4_ == 0);
                    auVar70._8_4_ = -(uint)(local_9e8._8_4_ == 0);
                    auVar70._12_4_ = -(uint)(local_9e8._12_4_ == 0);
                    auVar77 = auVar70 ^ _DAT_01febe20;
                    auVar74 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar70
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar74;
                    pRVar46 = args.ray;
                  }
                  auVar78._0_4_ = auVar77._0_4_ << 0x1f;
                  auVar78._4_4_ = auVar77._4_4_ << 0x1f;
                  auVar78._8_4_ = auVar77._8_4_ << 0x1f;
                  auVar78._12_4_ = auVar77._12_4_ << 0x1f;
                  iVar43 = movmskps((int)pRVar46,auVar78);
                  bVar66 = iVar43 == 0;
                  if (bVar66) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar62;
                    uVar48 = uVar48 ^ 1L << (uVar47 & 0x3f);
                  }
                }
                uVar96 = 0;
                if (!bVar66) {
                  if (bVar65) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar96 = 1;
                  }
                  goto LAB_0027640c;
                }
              } while (uVar48 != 0);
            }
          }
          uVar96 = 0;
          uVar44 = uVar44 + 1;
          bVar65 = uVar44 < local_9b8;
        } while (uVar44 != local_9b8);
      }
    }
LAB_0027640c:
  } while ((uVar96 & 3) == 0);
  return local_9c8 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }